

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_model<ExtIsoForest,char_const*>
               (ExtIsoForest *model,char **in,bool has_same_endianness,bool has_same_int_size,
               bool has_same_size_t_size,PlatformSize saved_int_t,PlatformSize saved_size_t,
               bool lacks_range_penalty,bool lacks_scoring_metric)

{
  runtime_error *this;
  byte in_CL;
  byte in_DL;
  byte in_R8B;
  int in_R9D;
  int in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  vector<char,_std::allocator<char>_> buffer;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  char **in_stack_fffffffffffffed8;
  ExtIsoForest *in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  char **in_stack_ffffffffffffff08;
  ExtIsoForest *in_stack_ffffffffffffff10;
  string local_68 [78];
  byte local_1a;
  byte local_19;
  int local_18;
  byte local_13;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_13 = in_R8B & 1;
  local_19 = in_stack_00000010 & 1;
  local_1a = in_stack_00000018 & 1;
  if ((((local_11 == 0) || (local_12 == 0)) || (local_13 == 0)) ||
     ((local_19 != 0 || (local_1a != 0)))) {
    local_18 = in_R9D;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x68251a);
    if ((local_18 == 1) && (in_stack_00000008 == 2)) {
      deserialize_model<char_const*,short,unsigned_int>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe,
                 (bool)in_stack_fffffffffffffefd);
    }
    else if ((local_18 == 2) && (in_stack_00000008 == 2)) {
      deserialize_model<char_const*,int,unsigned_int>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe,
                 (bool)in_stack_fffffffffffffefd);
    }
    else if ((local_18 == 3) && (in_stack_00000008 == 2)) {
      deserialize_model<char_const*,long,unsigned_int>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe,
                 (bool)in_stack_fffffffffffffefd);
    }
    else if ((local_18 == 1) && (in_stack_00000008 == 3)) {
      deserialize_model<char_const*,short,unsigned_long>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe,
                 (bool)in_stack_fffffffffffffefd);
    }
    else if ((local_18 == 2) && (in_stack_00000008 == 3)) {
      deserialize_model<char_const*,int,unsigned_long>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe,
                 (bool)in_stack_fffffffffffffefd);
    }
    else {
      if ((local_18 != 3) || (in_stack_00000008 != 3)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                   (allocator<char> *)in_stack_fffffffffffffe80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                   (allocator<char> *)in_stack_fffffffffffffe80);
        std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                   (allocator<char> *)in_stack_fffffffffffffe80);
        std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        std::__cxx11::to_string(in_stack_fffffffffffffe9c);
        std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                   (allocator<char> *)in_stack_fffffffffffffe80);
        std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        std::runtime_error::runtime_error(this,local_68);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      deserialize_model<char_const*,short,unsigned_long>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe,
                 (bool)in_stack_fffffffffffffefd);
    }
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffe60);
  }
  else {
    deserialize_model<char_const*>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  return;
}

Assistant:

void deserialize_model
(
    Model &model,
    itype &in,
    const bool has_same_endianness,
    const bool has_same_int_size,
    const bool has_same_size_t_size,
    const PlatformSize saved_int_t,
    const PlatformSize saved_size_t,
    const bool lacks_range_penalty,
    const bool lacks_scoring_metric
)
{
    if (has_same_endianness && has_same_int_size && has_same_size_t_size && !lacks_range_penalty && !lacks_scoring_metric)
    {
        deserialize_model(model, in);
        return;
    }

    std::vector<char> buffer;

    if (saved_int_t == Is16Bit && saved_size_t == Is32Bit)
    {
        deserialize_model<itype, int16_t, uint32_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is32Bit && saved_size_t == Is32Bit)
    {
        deserialize_model<itype, int32_t, uint32_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is64Bit && saved_size_t == Is32Bit)
    {
        deserialize_model<itype, int64_t, uint32_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is16Bit && saved_size_t == Is64Bit)
    {
        deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is32Bit && saved_size_t == Is64Bit)
    {
        deserialize_model<itype, int32_t, uint64_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is64Bit && saved_size_t == Is64Bit)
    {
        deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else
    {
        unexpected_error();
    }
}